

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O0

bool are_bool_matrices_equal(bool *matrix1,bool *matrix2,int width,int height)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  uint local_28;
  uint local_24;
  
  local_24 = 0;
  do {
    if (in_ECX <= (int)local_24) {
      return true;
    }
    for (local_28 = 0; (int)local_28 < in_EDX; local_28 = local_28 + 1) {
      if ((*(byte *)(in_RDI + (int)(local_24 * in_EDX + local_28)) & 1) !=
          (*(byte *)(in_RSI + (int)(local_24 * in_EDX + local_28)) & 1)) {
        printf("DIFFERENCE LAPLACIAN: (%i, %i)\n",(ulong)local_24,(ulong)local_28);
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

inline bool are_bool_matrices_equal(bool *matrix1, bool *matrix2, int width, int height) {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            if (matrix1[i * width + j] != matrix2[i * width + j]) {
                printf("DIFFERENCE LAPLACIAN: (%i, %i)\n", i, j);
                return false;
            }
        }
    }
    return true;
}